

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

int mime_mem_seek(void *instream,curl_off_t offset,int whence)

{
  curl_mimepart *part;
  curl_off_t cStack_20;
  int whence_local;
  curl_off_t offset_local;
  void *instream_local;
  
  if (whence == 1) {
    cStack_20 = *(long *)((long)instream + 0x90) + offset;
  }
  else {
    cStack_20 = offset;
    if (whence == 2) {
      cStack_20 = *(long *)((long)instream + 0x78) + offset;
    }
  }
  if ((cStack_20 < 0) || (*(long *)((long)instream + 0x78) < cStack_20)) {
    instream_local._4_4_ = 1;
  }
  else {
    *(curl_off_t *)((long)instream + 0x90) = cStack_20;
    instream_local._4_4_ = 0;
  }
  return instream_local._4_4_;
}

Assistant:

static int mime_mem_seek(void *instream, curl_off_t offset, int whence)
{
  curl_mimepart *part = (curl_mimepart *) instream;

  switch(whence) {
  case SEEK_CUR:
    offset += part->state.offset;
    break;
  case SEEK_END:
    offset += part->datasize;
    break;
  }

  if(offset < 0 || offset > part->datasize)
    return CURL_SEEKFUNC_FAIL;

  part->state.offset = offset;
  return CURL_SEEKFUNC_OK;
}